

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

void __thiscall
OpenMD::CubicSpline::addPoints
          (CubicSpline *this,vector<double,_std::allocator<double>_> *xps,
          vector<double,_std::allocator<double>_> *yps)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  uint i;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  undefined4 local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (vector<double,_std::allocator<double>_> *)(ulong)local_1c;
    pvVar1 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (pvVar1 <= this_00) break;
    std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)local_1c);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffc8 = (value_type_conflict2 *)(in_RDI + 0x40);
    std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)local_1c);
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffffc8);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void CubicSpline::addPoints(const std::vector<RealType>& xps,
                              const std::vector<RealType>& yps) {
    assert(xps.size() == yps.size());

    for (unsigned int i = 0; i < xps.size(); i++) {
      x_.push_back(xps[i]);
      y_.push_back(yps[i]);
    }
  }